

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcS.c
# Opt level: O3

void Gia_ManCountTents_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vRoots)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  
  if (iObj < p->nTravIdsAlloc) {
    do {
      if (p->pTravIds[iObj] == p->nTravIds) {
        return;
      }
      p->pTravIds[iObj] = p->nTravIds;
      if ((iObj < 0) || (p->nObjs <= iObj)) {
LAB_00576b71:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      uVar4 = (uint)*(undefined8 *)(pGVar3 + iObj);
      if (((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) {
        if ((~uVar4 & 0x9fffffff) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcS.c"
                        ,0x10c,"void Gia_ManCountTents_rec(Gia_Man_t *, int, Vec_Int_t *)");
        }
        uVar4 = (uint)((ulong)*(undefined8 *)(pGVar3 + iObj) >> 0x20) & 0x1fffffff;
        iVar1 = p->vCis->nSize;
        if ((int)uVar4 < iVar1 - p->nRegs) {
          return;
        }
        iVar2 = p->vCos->nSize;
        uVar4 = (iVar2 - iVar1) + uVar4;
        if (((int)uVar4 < 0) || (iVar2 <= (int)uVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        uVar4 = p->vCos->pArray[uVar4];
        if ((-1 < (long)(int)uVar4) && (uVar4 < (uint)p->nObjs)) {
          Vec_IntPush(vRoots,uVar4 - (*(uint *)(pGVar3 + (int)uVar4) & 0x1fffffff));
          return;
        }
        goto LAB_00576b71;
      }
      Gia_ManCountTents_rec(p,iObj - (uVar4 & 0x1fffffff),vRoots);
      iObj = iObj - (*(uint *)&pGVar3[iObj].field_0x4 & 0x1fffffff);
    } while (iObj < p->nTravIdsAlloc);
  }
  __assert_fail("Id < p->nTravIdsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
}

Assistant:

void Gia_ManCountTents_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vRoots )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_ManCountTents_rec( p, Gia_ObjFaninId0(pObj, iObj), vRoots );
        Gia_ManCountTents_rec( p, Gia_ObjFaninId1(pObj, iObj), vRoots );
    }
    else if ( Gia_ObjIsRo(p, pObj) )
        Vec_IntPush( vRoots, Gia_ObjFaninId0p(p, Gia_ObjRoToRi(p, pObj)) );
    else if ( !Gia_ObjIsPi(p, pObj) )
        assert( 0 );
}